

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fUniformLocationTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::UniformLocationCase::run
          (UniformLocationCase *this,
          vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
          *uniformList)

{
  deUint64 *__return_storage_ptr__;
  RenderContext *context;
  bool bVar1;
  int iVar2;
  int iVar3;
  deUint32 dVar4;
  CommandLine *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *str;
  ConstPixelBufferAccess local_258;
  PixelBufferAccess local_230;
  undefined4 local_204;
  undefined1 local_200 [8];
  Surface rendered;
  RandomViewport viewport;
  Functions *gl;
  int baseSeed;
  undefined1 local_1c0 [8];
  ShaderProgram program;
  ProgramSources sources;
  vector<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformInfo>_>
  *uniformList_local;
  UniformLocationCase *this_local;
  long lVar5;
  
  __return_storage_ptr__ = &program.m_program.m_info.linkTimeUs;
  genShaderSources((ProgramSources *)__return_storage_ptr__,uniformList);
  glu::ShaderProgram::ShaderProgram
            ((ShaderProgram *)local_1c0,this->m_renderCtx,(ProgramSources *)__return_storage_ptr__);
  this_00 = tcu::TestContext::getCommandLine((this->super_TestCase).super_TestNode.m_testCtx);
  iVar2 = tcu::CommandLine::getBaseSeed(this_00);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  str = tcu::TestNode::getName((TestNode *)this);
  dVar4 = deStringHash(str);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)&rendered.m_pixels.m_cap,
             (RenderTarget *)CONCAT44(extraout_var_00,iVar3),0x10,0x10,dVar4 + iVar2);
  tcu::Surface::Surface((Surface *)local_200,0x10,0x10);
  bVar1 = verifyLocations(this,(ShaderProgram *)local_1c0,uniformList);
  if (bVar1) {
    (**(code **)(lVar5 + 0x1c0))(0,0,0,0x3f800000);
    (**(code **)(lVar5 + 0x188))(0x4500);
    (**(code **)(lVar5 + 0x1a00))
              ((int)rendered.m_pixels.m_cap,rendered.m_pixels.m_cap._4_4_,viewport.x,viewport.y);
    render(this,(ShaderProgram *)local_1c0,uniformList);
    context = this->m_renderCtx;
    tcu::Surface::getAccess(&local_230,(Surface *)local_200);
    glu::readPixels(context,(int)rendered.m_pixels.m_cap,rendered.m_pixels.m_cap._4_4_,&local_230);
    tcu::Surface::getAccess((PixelBufferAccess *)&local_258,(Surface *)local_200);
    bVar1 = verifyResult(&local_258);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Shader produced incorrect result");
    }
  }
  local_204 = 1;
  tcu::Surface::~Surface((Surface *)local_200);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_1c0);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&program.m_program.m_info.linkTimeUs);
  return STOP;
}

Assistant:

UniformLocationCase::IterateResult UniformLocationCase::run (const vector<UniformInfo>& uniformList)
{
	using gls::TextureTestUtil::RandomViewport;

	const glu::ProgramSources	sources		= genShaderSources(uniformList);
	const glu::ShaderProgram	program		(m_renderCtx, sources);
	const int					baseSeed	= m_testCtx.getCommandLine().getBaseSeed();
	const glw::Functions&		gl			= m_renderCtx.getFunctions();
	const RandomViewport		viewport	(m_renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()) + baseSeed);

	tcu::Surface				rendered	(RENDER_SIZE, RENDER_SIZE);

	if (!verifyLocations(program, uniformList))
		return STOP;

	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

	render(program, uniformList);

	glu::readPixels(m_renderCtx, viewport.x, viewport.y, rendered.getAccess());

	if (!verifyResult(rendered.getAccess()))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Shader produced incorrect result");
		return STOP;
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}